

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::saveModel(FastText *this)

{
  string fn;
  string local_50;
  string local_30 [32];
  
  std::__cxx11::string::string
            (local_30,(string *)
                      &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr)->output);
  std::__cxx11::string::append((char *)local_30);
  std::__cxx11::string::string((string *)&local_50,local_30);
  saveModel(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void FastText::saveModel() {
  std::string fn(args_->output);
  if (quant_) {
    fn += ".ftz";
  } else {
    fn += ".bin";
  }
  saveModel(fn);
}